

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_parser.c
# Opt level: O0

gnode_t * parse_empty_statement(gravity_parser_t *parser)

{
  gtoken_s token_00;
  gnode_t *pgVar1;
  gnode_t *local_48;
  undefined1 auStack_40 [8];
  gtoken_s token;
  gravity_lexer_t *lexer;
  gravity_parser_t *parser_local;
  
  token.value = (char *)parser->lexer->p[parser->lexer->n - 1];
  gravity_lexer_next((gravity_lexer_t *)token.value);
  gravity_lexer_token((gtoken_s *)auStack_40,(gravity_lexer_t *)token.value);
  if (parser->declarations->n == 0) {
    local_48 = (gnode_t *)0x0;
  }
  else {
    local_48 = parser->declarations->p[parser->declarations->n - 1];
  }
  token_00.colno = token.type;
  token_00.position = token.lineno;
  token_00.type = auStack_40._0_4_;
  token_00.lineno = auStack_40._4_4_;
  token_00.bytes = token.colno;
  token_00.length = token.position;
  token_00.fileid = token.bytes;
  token_00.builtin = token.length;
  token_00.value = (char *)token._24_8_;
  pgVar1 = gnode_empty_stat_create(token_00,local_48);
  return pgVar1;
}

Assistant:

static gnode_t *parse_empty_statement (gravity_parser_t *parser) {
    DEBUG_PARSER("parse_empty_statement");

    // ;

    DECLARE_LEXER;
    gravity_lexer_next(lexer);
    gtoken_s token = gravity_lexer_token(lexer);
    return gnode_empty_stat_create(token, LAST_DECLARATION());
}